

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O0

FADFADSTATE * FADexp(FADFADSTATE *x)

{
  int iVar1;
  Fad<Fad<double>_> *in_RSI;
  FADFADSTATE *in_RDI;
  int i;
  int sz;
  Fad<double> expaval;
  FADFADSTATE *expa;
  int in_stack_ffffffffffffff2c;
  Fad<Fad<double>_> *in_stack_ffffffffffffff30;
  FADFADSTATE *this;
  Fad<double> *in_stack_ffffffffffffff60;
  Fad<double> *in_stack_ffffffffffffff68;
  FadExpr<FadFuncExp<Fad<double>_>_> *in_stack_ffffffffffffff78;
  Fad<double> *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  int iVar2;
  undefined4 in_stack_ffffffffffffff94;
  
  this = in_RDI;
  Fad<Fad<double>_>::val(in_RSI);
  exp<double>(in_stack_ffffffffffffff68);
  Fad<double>::Fad<FadFuncExp<Fad<double>>>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  FadExpr<FadFuncExp<Fad<double>_>_>::~FadExpr
            ((FadExpr<FadFuncExp<Fad<double>_>_> *)in_stack_ffffffffffffff30);
  iVar1 = Fad<Fad<double>_>::size((Fad<Fad<double>_> *)0x1e4d226);
  Fad<Fad<double>_>::Fad
            ((Fad<Fad<double>_> *)
             (CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90) & 0xffffffffffffff),
             in_stack_ffffffffffffff8c,in_stack_ffffffffffffff80);
  for (iVar2 = 0; iVar2 < iVar1; iVar2 = iVar2 + 1) {
    Fad<Fad<double>_>::dx(in_RDI,(int)((ulong)in_RSI >> 0x20));
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    in_stack_ffffffffffffff30 =
         (Fad<Fad<double>_> *)
         Fad<Fad<double>_>::fastAccessDx(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    Fad<double>::operator=
              ((Fad<double> *)this,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_RDI);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffff30);
    Fad<double>::~Fad((Fad<double> *)in_stack_ffffffffffffff30);
  }
  Fad<double>::~Fad((Fad<double> *)in_stack_ffffffffffffff30);
  return this;
}

Assistant:

static FADFADSTATE FADexp(FADFADSTATE x)
{
    Fad<STATE> expaval = exp(x.val());
    int sz = x.size();
    FADFADSTATE expa(sz,expaval);
    for (int i=0; i<sz; i++) {
        expa.fastAccessDx(i) = expaval*x.dx(i);
    }
    return expa;
}